

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

string * __thiscall
adios2::format::BPBase::ReadBPString_abi_cxx11_
          (BPBase *this,vector<char,_std::allocator<char>_> *buffer,size_t *position,
          bool isLittleEndian)

{
  unsigned_short uVar1;
  const_reference pvVar2;
  size_type *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  string *in_RDI;
  byte in_R8B;
  size_t size;
  string *values;
  size_t *in_stack_ffffffffffffff98;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  ulong uVar3;
  allocator local_33;
  undefined1 local_32;
  allocator local_31;
  ulong local_30;
  byte local_21;
  size_type *local_20;
  vector<char,_std::allocator<char>_> *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar1 = helper::ReadValue<unsigned_short>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,false);
  local_30 = (ulong)uVar1;
  if (local_30 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    local_32 = 0;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_18,*local_20);
    uVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pvVar2,uVar3,&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    *local_20 = local_30 + *local_20;
  }
  return in_RDI;
}

Assistant:

std::string BPBase::ReadBPString(const std::vector<char> &buffer, size_t &position,
                                 const bool isLittleEndian) const noexcept
{
    const size_t size =
        static_cast<size_t>(helper::ReadValue<uint16_t>(buffer, position, isLittleEndian));

    if (size == 0)
    {
        return "";
    }

    const std::string values(&buffer[position], size);
    position += size;
    return values;
}